

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::run(search *sch,multi_ex *ec)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  action aVar5;
  task_data *D_00;
  reference pvVar6;
  reference pvVar7;
  reference ppeVar8;
  size_t sVar9;
  wclass *pwVar10;
  reference this;
  predictor *ppVar11;
  search *psVar12;
  long lVar13;
  ulong uVar14;
  stringstream *psVar15;
  ostream *poVar16;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  uint32_t n_3;
  uint32_t n_2;
  uint32_t m;
  size_t j;
  size_t i;
  predictor P;
  bool add_features;
  uint32_t k;
  uint32_t n_1;
  int n_id;
  int step;
  int end;
  int start;
  bool last_loop;
  size_t loop;
  size_t n;
  float loss_val;
  task_data *D;
  undefined4 in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  predictor *in_stack_fffffffffffffe00;
  multi_ex *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  uint32_t *puVar17;
  float in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  uint32_t local_17c;
  float local_168;
  uint local_164;
  uint local_160;
  uint in_stack_fffffffffffffea4;
  search *in_stack_fffffffffffffea8;
  search *psVar18;
  predictor *in_stack_fffffffffffffeb0;
  predictor *ppVar19;
  predictor *in_stack_fffffffffffffed8;
  multi_ex *in_stack_fffffffffffffee8;
  uint *in_stack_fffffffffffffef0;
  task_data *in_stack_fffffffffffffef8;
  search *in_stack_ffffffffffffff00;
  uint32_t local_44;
  int local_40;
  uint32_t local_3c;
  uint32_t local_38;
  ulong local_30;
  ulong local_28;
  
  D_00 = Search::search::get_task_data<GraphTask::task_data>(in_RDI);
  local_168 = (float)D_00->num_loops;
  for (local_28 = 0; local_28 < D_00->N; local_28 = local_28 + 1) {
    sVar3 = D_00->K;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&D_00->pred,local_28);
    *pvVar6 = sVar3 + 1;
  }
  for (local_30 = 0; local_30 < D_00->num_loops; local_30 = local_30 + 1) {
    sVar3 = D_00->num_loops;
    local_38 = 0;
    local_3c = D_00->N;
    local_40 = 1;
    if ((local_30 & 1) == 1) {
      local_38 = D_00->N - 1;
      local_3c = 0xffffffff;
      local_40 = -1;
    }
    for (local_44 = local_38; local_44 != local_3c; local_44 = local_40 + local_44) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&D_00->bfs,(long)(int)local_44);
      uVar1 = *pvVar7;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)uVar1);
      sVar9 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
      if (sVar9 == 0) {
        local_17c = 0;
      }
      else {
        ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (in_RSI,(ulong)uVar1);
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                            ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,0);
        local_17c = pwVar10->class_index;
      }
      bVar4 = Search::search::predictNeedsExample((search *)0x3d45fa);
      if (bVar4) {
        add_edge_features(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      Search::predictor::predictor
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)uVar1);
      Search::predictor::set_input
                (in_stack_fffffffffffffe00,
                 (example *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if ((D_00->separate_learners & 1U) != 0) {
        Search::predictor::set_learner_id((predictor *)&stack0xfffffffffffffec8,local_30);
      }
      if (local_17c != 0) {
        Search::predictor::set_oracle(in_stack_fffffffffffffe00,(action)in_stack_fffffffffffffdfc);
      }
      ppVar19 = (predictor *)0x0;
      while( true ) {
        in_stack_fffffffffffffeb0 = ppVar19;
        this = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&D_00->adj,(ulong)uVar1);
        ppVar11 = (predictor *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this);
        if (ppVar11 <= ppVar19) break;
        psVar18 = (search *)0x0;
        while( true ) {
          in_stack_fffffffffffffea8 = psVar18;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (in_RSI,(size_type)in_stack_fffffffffffffeb0);
          psVar12 = (search *)
                    v_array<COST_SENSITIVE::wclass>::size
                              ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
          if (psVar12 <= psVar18) break;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (in_RSI,(size_type)in_stack_fffffffffffffeb0);
          pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                              ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,
                               (size_t)in_stack_fffffffffffffea8);
          if (pwVar10->class_index == 0) {
            in_stack_fffffffffffffea4 = 0;
          }
          else {
            in_stack_fffffffffffffea4 = pwVar10->class_index - 1;
            if (in_stack_fffffffffffffea4 != uVar1) {
              Search::predictor::add_condition
                        (in_stack_fffffffffffffe00,(ptag)in_stack_fffffffffffffdfc,
                         (char)((uint)in_stack_fffffffffffffdf8 >> 0x18));
            }
          }
          psVar18 = (search *)((long)&in_stack_fffffffffffffea8->priv + 1);
        }
        ppVar19 = (predictor *)&in_stack_fffffffffffffeb0->field_0x1;
      }
      aVar5 = Search::predictor::predict(in_stack_fffffffffffffed8);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&D_00->pred,(ulong)uVar1);
      *pvVar6 = (ulong)aVar5;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)uVar1);
      sVar9 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
      if (sVar9 != 0) {
        ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (in_RSI,(ulong)uVar1);
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                            ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,0);
        uVar2 = pwVar10->class_index;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&D_00->pred,(ulong)uVar1);
        if ((ulong)uVar2 == *pvVar6) {
          in_stack_fffffffffffffe24 = 0.0;
        }
        else {
          in_stack_fffffffffffffe20 = 0.5 / local_168;
          in_stack_fffffffffffffe24 = 0.5 / local_168;
          if (local_30 == sVar3 - 1) {
            in_stack_fffffffffffffe20 = 0.5;
            in_stack_fffffffffffffe24 = 0.5;
          }
        }
        Search::search::loss((search *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      }
      if (bVar4) {
        del_edge_features((task_data *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                          ,(uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                          in_stack_fffffffffffffe10);
      }
      Search::predictor::~predictor(in_stack_fffffffffffffe00);
    }
  }
  for (local_160 = 0; local_160 < D_00->N; local_160 = local_160 + 1) {
    puVar17 = D_00->confusion_matrix;
    ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (in_RSI,(ulong)local_160);
    pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                        ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,0);
    lVar13 = (ulong)pwVar10->class_index * (D_00->K + 1);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&D_00->pred,(ulong)local_160);
    puVar17[lVar13 + *pvVar6] = puVar17[lVar13 + *pvVar6] + 1;
  }
  macro_f(D_00);
  Search::search::loss((search *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Search::search::output_abi_cxx11_(in_RDI);
  uVar14 = std::ios::good();
  if ((uVar14 & 1) != 0) {
    for (local_164 = 0; local_164 < D_00->N; local_164 = local_164 + 1) {
      psVar15 = Search::search::output_abi_cxx11_(in_RDI);
      psVar15 = psVar15 + 0x10;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&D_00->pred,(ulong)local_164);
      poVar16 = (ostream *)std::ostream::operator<<(psVar15,*pvVar6);
      std::operator<<(poVar16,' ');
    }
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  float loss_val = 0.5f / (float)D.num_loops;
  for (size_t n = 0; n < D.N; n++) D.pred[n] = D.K + 1;

  for (size_t loop = 0; loop < D.num_loops; loop++)
  {
    bool last_loop = loop == (D.num_loops - 1);
    int start = 0;
    int end = D.N;
    int step = 1;
    if (loop % 2 == 1)
    {
      start = D.N - 1;
      end = -1;
      step = -1;
    }  // go inward on odd loops
    for (int n_id = start; n_id != end; n_id += step)
    {
      uint32_t n = D.bfs[n_id];
      uint32_t k = (ec[n]->l.cs.costs.size() > 0) ? ec[n]->l.cs.costs[0].class_index : 0;

      bool add_features = /* D.use_structure && */ sch.predictNeedsExample();
      // add_features = false;

      if (add_features)
        add_edge_features(sch, D, n, ec);
      Search::predictor P = Search::predictor(sch, n + 1);
      P.set_input(*ec[n]);
      if (false && (k > 0))
      {
        float min_count = 1e12f;
        for (size_t k2 = 1; k2 <= D.K; k2++) min_count = min(min_count, D.true_counts[k2]);
        float w = min_count / D.true_counts[k];
        // float w = D.true_counts_total / D.true_counts[k] / (float)(D.K);
        P.set_weight(w);
        // cerr << "w = " << D.true_counts_total / D.true_counts[k] / (float)(D.K) << endl;
        // P.set_weight( D.true_counts_total / D.true_counts[k] / (float)(D.K) );
      }
      if (D.separate_learners)
        P.set_learner_id(loop);
      if (k > 0)  // for test examples
        P.set_oracle(k);
      // add all the conditioning
      for (size_t i = 0; i < D.adj[n].size(); i++)
      {
        for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            continue;
          m--;
          if (m == n)
            continue;
          P.add_condition(m + 1, 'e');
        }
      }

      // make the prediction
      D.pred[n] = P.predict();
      if (ec[n]->l.cs.costs.size() > 0)  // for test examples
        sch.loss((ec[n]->l.cs.costs[0].class_index == D.pred[n]) ? 0.f : (last_loop ? 0.5f : loss_val));

      if (add_features)
        del_edge_features(D, n, ec);
    }
  }

  for (uint32_t n = 0; n < D.N; n++) D.confusion_matrix[IDX(ec[n]->l.cs.costs[0].class_index, D.pred[n])]++;
  sch.loss(1.f - macro_f(D));

  if (sch.output().good())
    for (uint32_t n = 0; n < D.N; n++) sch.output() << D.pred[n] << ' ';
}